

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O2

void __thiscall icu_63::RangeDescriptor::setDictionaryFlag(RangeDescriptor *this)

{
  byte *pbVar1;
  int *piVar2;
  int8_t iVar3;
  void *pvVar4;
  int index;
  ConstChar16Ptr local_40;
  char16_t *local_38;
  
  index = 0;
  do {
    if (this->fIncludesSets->count <= index) {
      return;
    }
    pvVar4 = UVector::elementAt(this->fIncludesSets,index);
    if (((*(long *)((long)pvVar4 + 8) != 0) &&
        (piVar2 = *(int **)(*(long *)((long)pvVar4 + 8) + 8), piVar2 != (int *)0x0)) &&
       (*piVar2 == 2)) {
      local_40.p_ = L"dictionary";
      iVar3 = UnicodeString::compare((UnicodeString *)(piVar2 + 0xc),&local_40,-1);
      local_38 = local_40.p_;
      if (iVar3 == '\0') {
        pbVar1 = (byte *)((long)&this->fNum + 1);
        *pbVar1 = *pbVar1 | 0x40;
        return;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void RangeDescriptor::setDictionaryFlag() {
    int i;

    static const char16_t *dictionary = u"dictionary";
    for (i=0; i<fIncludesSets->size(); i++) {
        RBBINode *usetNode  = (RBBINode *)fIncludesSets->elementAt(i);
        RBBINode *setRef = usetNode->fParent;
        if (setRef != nullptr) {
            RBBINode *varRef = setRef->fParent;
            if (varRef && varRef->fType == RBBINode::varRef) {
                const UnicodeString *setName = &varRef->fText;
                if (setName->compare(dictionary, -1) == 0) {
                    fNum |= RBBISetBuilder::DICT_BIT;
                    break;
                }
            }
        }
    }
}